

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCommandLineArguments.cxx
# Opt level: O3

int testCommandLineArguments(int argc,char **argv)

{
  double dVar1;
  char *pcVar2;
  char *__s;
  int iVar3;
  int iVar4;
  size_t sVar5;
  long *plVar6;
  ostream *poVar7;
  uint uVar8;
  undefined4 uVar9;
  int *piVar10;
  double *pdVar11;
  undefined **ppuVar12;
  ulong uVar13;
  long *plVar14;
  long lVar15;
  long lVar16;
  bool bool_arg1;
  bool some_bool_variable1;
  bool some_bool_variable;
  vector<char_*,_std::allocator<char_*>_> strings_argument;
  int bool_arg2;
  int some_int_variable;
  char *some_string_variable;
  vector<double,_std::allocator<double>_> doubles_argument;
  vector<int,_std::allocator<int>_> numbers_argument;
  CommandLineArguments arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  stl_strings_argument;
  double some_double_variable;
  string some_stl_string_variable;
  string valid_stl_strings [4];
  bool local_1d3;
  bool local_1d2;
  bool local_1d1;
  double local_1d0;
  vector<char_*,_std::allocator<char_*>_> local_1c8;
  int local_1a8;
  int local_1a4;
  char *local_1a0;
  vector<double,_std::allocator<double>_> local_198;
  vector<int,_std::allocator<int>_> local_178;
  CommandLineArguments local_158;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  vector<bool,_std::allocator<bool>_> local_108;
  double local_e0;
  string local_d8;
  undefined1 *local_b8;
  size_t sStack_b0;
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  long *local_58 [2];
  long local_48 [3];
  
  cmsys::CommandLineArguments::CommandLineArguments(&local_158);
  cmsys::CommandLineArguments::Initialize(&local_158,argc,argv);
  cmsys::CommandLineArguments::SetClientData(&local_158,(void *)0x123);
  cmsys::CommandLineArguments::SetUnknownArgumentCallback(&local_158,unknown_argument);
  local_1a4 = 10;
  local_e0 = 10.1;
  local_1a0 = (char *)0x0;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
  local_1d1 = false;
  local_1d2 = false;
  local_1d3 = false;
  local_1a8 = 0;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (ulong *)0x0;
  local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"ken","");
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"brad","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"bill","");
  plVar14 = local_48;
  local_58[0] = plVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"andy","");
  cmsys::CommandLineArguments::AddArgument
            (&local_158,"--some-int-variable",SPACE_ARGUMENT,&local_1a4,
             "Set some random int variable");
  cmsys::CommandLineArguments::AddArgument
            (&local_158,"--some-double-variable",CONCAT_ARGUMENT,&local_e0,
             "Set some random double variable");
  cmsys::CommandLineArguments::AddArgument
            (&local_158,"--some-string-variable",EQUAL_ARGUMENT,&local_1a0,
             "Set some random string variable");
  cmsys::CommandLineArguments::AddArgument
            (&local_158,"--some-stl-string-variable",EQUAL_ARGUMENT,&local_d8,
             "Set some random stl string variable");
  cmsys::CommandLineArguments::AddArgument
            (&local_158,"--some-bool-variable",EQUAL_ARGUMENT,&local_1d1,
             "Set some random bool variable");
  cmsys::CommandLineArguments::AddArgument
            (&local_158,"--another-bool-variable",NO_ARGUMENT,&local_1d2,
             "Set some random bool variable 1");
  cmsys::CommandLineArguments::AddBooleanArgument
            (&local_158,"--set-bool-arg1",&local_1d3,"Test AddBooleanArgument 1");
  cmsys::CommandLineArguments::AddBooleanArgument
            (&local_158,"--set-bool-arg2",&local_1a8,"Test AddBooleanArgument 2");
  cmsys::CommandLineArguments::AddArgument
            (&local_158,"--some-multi-argument",MULTI_ARGUMENT,&local_178,
             "Some multiple values variable");
  cmsys::CommandLineArguments::AddArgument
            (&local_158,"-N",SPACE_ARGUMENT,&local_198,"Some explicit multiple values variable");
  cmsys::CommandLineArguments::AddArgument
            (&local_158,"-BB",CONCAT_ARGUMENT,&local_108,"Some explicit multiple values variable");
  cmsys::CommandLineArguments::AddArgument
            (&local_158,"-SS",EQUAL_ARGUMENT,&local_1c8,"Some explicit multiple values variable");
  cmsys::CommandLineArguments::AddArgument
            (&local_158,"-SSS",MULTI_ARGUMENT,&local_128,"Some explicit multiple values variable");
  cmsys::CommandLineArguments::AddCallback
            (&local_158,"-A",NO_ARGUMENT,argument,(void *)0x123,
             "Some option -A. This option has a multiline comment. It should demonstrate how the code splits lines."
            );
  cmsys::CommandLineArguments::AddCallback
            (&local_158,"-B",SPACE_ARGUMENT,argument,(void *)0x123,
             "Option -B takes argument with space");
  cmsys::CommandLineArguments::AddCallback
            (&local_158,"-C",EQUAL_ARGUMENT,argument,(void *)0x123,
             "Option -C takes argument after =");
  cmsys::CommandLineArguments::AddCallback
            (&local_158,"-D",CONCAT_ARGUMENT,argument,(void *)0x123,
             "This option takes concatinated argument");
  cmsys::CommandLineArguments::AddCallback
            (&local_158,"--long1",NO_ARGUMENT,argument,(void *)0x123,"-A");
  cmsys::CommandLineArguments::AddCallback
            (&local_158,"--long2",SPACE_ARGUMENT,argument,(void *)0x123,"-B");
  cmsys::CommandLineArguments::AddCallback
            (&local_158,"--long3",EQUAL_ARGUMENT,argument,(void *)0x123,
             "Same as -C but a bit different");
  cmsys::CommandLineArguments::AddCallback
            (&local_158,"--long4",CONCAT_ARGUMENT,argument,(void *)0x123,"-C");
  iVar3 = cmsys::CommandLineArguments::Parse(&local_158);
  if (iVar3 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem parsing arguments",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
  }
  uVar8 = (uint)(iVar3 == 0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Help: ",6);
  if (local_158.Help._M_dataplus._M_p == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x14d450);
  }
  else {
    sVar5 = strlen(local_158.Help._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,local_158.Help._M_dataplus._M_p,sVar5);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Some int variable was set to: ",0x1e);
  plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_1a4);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Some double variable was set to: ",0x21);
  poVar7 = std::ostream::_M_insert<double>(local_e0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if ((local_1a0 == (char *)0x0) || (iVar3 = strcmp(local_1a0,"test string with space"), iVar3 != 0)
     ) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem setting string variable",0x1f);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
    std::ostream::put('\x10');
    uVar8 = 1;
    std::ostream::flush();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Some string variable was set to: ",0x21);
    pcVar2 = local_1a0;
    if (local_1a0 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x14d450);
    }
    else {
      sVar5 = strlen(local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
    if (local_1a0 != (char *)0x0) {
      operator_delete__(local_1a0);
    }
  }
  if ((long)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == 0x28) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"numbers_argument argument set:",0x1e);
    local_1d0 = (double)CONCAT44(local_1d0._4_4_,uVar8);
    piVar10 = &DAT_0013e020;
    lVar15 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      std::ostream::operator<<
                ((ostream *)&std::cout,
                 local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar15]);
      iVar3 = *piVar10;
      if (local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar15] != iVar3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Problem setting numbers_argument. Value of ",0x2b);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," is: [",6);
        poVar7 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)poVar7,
                            local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar15]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] <> [",6);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,iVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        uVar9 = 1;
        std::ostream::flush();
        goto LAB_0011ff77;
      }
      lVar15 = lVar15 + 1;
      piVar10 = piVar10 + 1;
    } while (lVar15 != 10);
    uVar9 = local_1d0._0_4_;
LAB_0011ff77:
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem setting numbers_argument. Size is: ",0x2b);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," should be: ",0xc);
    plVar6 = (long *)std::ostream::operator<<((ostream *)poVar7,10);
    std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
    std::ostream::put((char)plVar6);
    uVar9 = 1;
    std::ostream::flush();
  }
  if ((long)local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start == 0x18) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"doubles_argument argument set:",0x1e);
    pdVar11 = (double *)&DAT_0013e050;
    lVar15 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      std::ostream::_M_insert<double>
                (local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar15]);
      dVar1 = *pdVar11;
      if ((local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar15] != dVar1) ||
         (NAN(local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar15]) || NAN(dVar1))) {
        local_1d0 = dVar1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Problem setting doubles_argument. Value of ",0x2b);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," is: [",6);
        poVar7 = std::ostream::_M_insert<double>
                           (local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar15]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] <> [",6);
        poVar7 = std::ostream::_M_insert<double>(local_1d0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        uVar9 = 1;
        std::ostream::flush();
        break;
      }
      lVar15 = lVar15 + 1;
      pdVar11 = pdVar11 + 1;
    } while (lVar15 != 3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem setting doubles_argument. Size is: ",0x2b);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," should be: ",0xc);
    plVar6 = (long *)std::ostream::operator<<((ostream *)poVar7,3);
    std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
    std::ostream::put((char)plVar6);
    uVar9 = 1;
    std::ostream::flush();
  }
  if ((ulong)local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset +
      ((long)local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p -
      (long)local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8 == 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"bools_argument argument set:",0x1c);
    local_1d0 = (double)CONCAT44(local_1d0._4_4_,uVar9);
    lVar15 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      std::ostream::_M_insert<bool>(true);
      if (((*local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p & 1L << ((byte)lVar15 & 0x3f)) == 0) ==
          (bool)(&DAT_0013d8fe)[lVar15]) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Problem setting bools_argument. Value of ",0x29);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," is: [",6);
        poVar7 = std::ostream::_M_insert<bool>(SUB81(poVar7,0));
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] <> [",6);
        poVar7 = std::ostream::_M_insert<bool>(SUB81(poVar7,0));
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        uVar9 = 1;
        std::ostream::flush();
        goto LAB_001203c1;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    uVar9 = local_1d0._0_4_;
LAB_001203c1:
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem setting bools_argument. Size is: ",0x29);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," should be: ",0xc);
    plVar6 = (long *)std::ostream::operator<<((ostream *)poVar7,3);
    std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
    std::ostream::put((char)plVar6);
    uVar9 = 1;
    std::ostream::flush();
  }
  if ((long)local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_start == 0x20) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"strings_argument argument set:",0x1e);
    local_1d0 = (double)CONCAT44(local_1d0._4_4_,uVar9);
    ppuVar12 = &PTR_anon_var_dwarf_32a11_0014bcb0;
    lVar15 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      pcVar2 = local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
               super__Vector_impl_data._M_start[lVar15];
      if (pcVar2 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x14d450);
      }
      else {
        sVar5 = strlen(pcVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,sVar5);
      }
      pcVar2 = *ppuVar12;
      iVar3 = strcmp(local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar15],pcVar2);
      if (iVar3 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Problem setting strings_argument. Value of ",0x2b);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," is: [",6);
        __s = local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_start[lVar15];
        if (__s == (char *)0x0) {
          std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
        }
        else {
          sVar5 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,__s,sVar5);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] <> [",6);
        sVar5 = strlen(pcVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar2,sVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        iVar3 = 1;
        std::ostream::flush();
        goto LAB_00120669;
      }
      lVar15 = lVar15 + 1;
      ppuVar12 = ppuVar12 + 1;
    } while (lVar15 != 4);
    iVar3 = local_1d0._0_4_;
LAB_00120669:
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem setting strings_argument. Size is: ",0x2b);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," should be: ",0xc);
    plVar6 = (long *)std::ostream::operator<<((ostream *)poVar7,4);
    std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
    std::ostream::put((char)plVar6);
    iVar3 = 1;
    std::ostream::flush();
  }
  if ((long)local_128.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_128.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x80) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"stl_strings_argument argument set:",0x22);
    lVar15 = 8;
    lVar16 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 *(char **)((long)local_128.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar15 + -8),
                 *(long *)((long)&((local_128.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar15));
      sVar5 = *(size_t *)
               ((long)&((local_128.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar15);
      if ((sVar5 != *(size_t *)((long)&local_b8 + lVar15)) ||
         ((sVar5 != 0 &&
          (iVar4 = bcmp(*(void **)((long)local_128.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar15 + -8),
                        *(void **)((long)&local_d8.field_2 + lVar15 + 8),sVar5), iVar4 != 0)))) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Problem setting stl_strings_argument. Value of ",0x2f);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," is: [",6);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,*(char **)((long)local_128.
                                                                                                        
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                             lVar15 + -8),
                            *(long *)((long)&((local_128.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar15));
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] <> [",6);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,*(char **)((long)&local_d8.field_2 + lVar15 + 8),
                            *(long *)((long)&local_b8 + lVar15));
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        iVar3 = 1;
        std::ostream::flush();
        break;
      }
      lVar16 = lVar16 + 1;
      lVar15 = lVar15 + 0x20;
    } while (lVar16 != 4);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem setting stl_strings_argument. Size is: ",0x2f);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," should be: ",0xc);
    plVar6 = (long *)std::ostream::operator<<((ostream *)poVar7,4);
    std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
    std::ostream::put((char)plVar6);
    iVar3 = 1;
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Some STL String variable was set to: ",0x25);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_d8._M_dataplus._M_p,local_d8._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Some bool variable was set to: ",0x1f);
  poVar7 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Some bool variable was set to: ",0x1f);
  poVar7 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"bool_arg1 variable was set to: ",0x1f);
  poVar7 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"bool_arg2 variable was set to: ",0x1f);
  plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_1a8);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  if (local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar13 = 0;
    do {
      if (local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar13] != (char *)0x0) {
        operator_delete__(local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar13]);
      }
      local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar13] = (char *)0x0;
      uVar13 = uVar13 + 1;
    } while (uVar13 < (ulong)((long)local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  lVar15 = -0x80;
  do {
    if (plVar14 != (long *)plVar14[-2]) {
      operator_delete((long *)plVar14[-2],*plVar14 + 1);
    }
    plVar14 = plVar14 + -4;
    lVar15 = lVar15 + 0x20;
  } while (lVar15 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_128);
  if (local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (ulong *)0x0) {
    operator_delete(local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  cmsys::CommandLineArguments::~CommandLineArguments(&local_158);
  return iVar3;
}

Assistant:

int testCommandLineArguments(int argc, char* argv[])
{
  // Example run: ./testCommandLineArguments --some-int-variable 4
  // --another-bool-variable --some-bool-variable=yes
  // --some-stl-string-variable=foobar --set-bool-arg1 --set-bool-arg2
  // --some-string-variable=hello

  int res = 0;
  kwsys::CommandLineArguments arg;
  arg.Initialize(argc, argv);

  // For error handling
  arg.SetClientData(random_ptr);
  arg.SetUnknownArgumentCallback(unknown_argument);

  int some_int_variable = 10;
  double some_double_variable = 10.10;
  char* some_string_variable = 0;
  std::string some_stl_string_variable = "";
  bool some_bool_variable = false;
  bool some_bool_variable1 = false;
  bool bool_arg1 = false;
  int bool_arg2 = 0;

  std::vector<int> numbers_argument;
  int valid_numbers[] = { 5, 1, 8, 3, 7, 1, 3, 9, 7, 1 };

  std::vector<double> doubles_argument;
  double valid_doubles[] = { 12.5, 1.31, 22 };

  std::vector<bool> bools_argument;
  bool valid_bools[] = { true, true, false };

  std::vector<char*> strings_argument;
  const char* valid_strings[] = { "andy", "bill", "brad", "ken" };

  std::vector<std::string> stl_strings_argument;
  std::string valid_stl_strings[] = { "ken", "brad", "bill", "andy" };

  typedef kwsys::CommandLineArguments argT;

  arg.AddArgument("--some-int-variable", argT::SPACE_ARGUMENT,
                  &some_int_variable, "Set some random int variable");
  arg.AddArgument("--some-double-variable", argT::CONCAT_ARGUMENT,
                  &some_double_variable, "Set some random double variable");
  arg.AddArgument("--some-string-variable", argT::EQUAL_ARGUMENT,
                  &some_string_variable, "Set some random string variable");
  arg.AddArgument("--some-stl-string-variable", argT::EQUAL_ARGUMENT,
                  &some_stl_string_variable,
                  "Set some random stl string variable");
  arg.AddArgument("--some-bool-variable", argT::EQUAL_ARGUMENT,
                  &some_bool_variable, "Set some random bool variable");
  arg.AddArgument("--another-bool-variable", argT::NO_ARGUMENT,
                  &some_bool_variable1, "Set some random bool variable 1");
  arg.AddBooleanArgument("--set-bool-arg1", &bool_arg1,
                         "Test AddBooleanArgument 1");
  arg.AddBooleanArgument("--set-bool-arg2", &bool_arg2,
                         "Test AddBooleanArgument 2");
  arg.AddArgument("--some-multi-argument", argT::MULTI_ARGUMENT,
                  &numbers_argument, "Some multiple values variable");
  arg.AddArgument("-N", argT::SPACE_ARGUMENT, &doubles_argument,
                  "Some explicit multiple values variable");
  arg.AddArgument("-BB", argT::CONCAT_ARGUMENT, &bools_argument,
                  "Some explicit multiple values variable");
  arg.AddArgument("-SS", argT::EQUAL_ARGUMENT, &strings_argument,
                  "Some explicit multiple values variable");
  arg.AddArgument("-SSS", argT::MULTI_ARGUMENT, &stl_strings_argument,
                  "Some explicit multiple values variable");

  arg.AddCallback("-A", argT::NO_ARGUMENT, argument, random_ptr,
                  "Some option -A. This option has a multiline comment. It "
                  "should demonstrate how the code splits lines.");
  arg.AddCallback("-B", argT::SPACE_ARGUMENT, argument, random_ptr,
                  "Option -B takes argument with space");
  arg.AddCallback("-C", argT::EQUAL_ARGUMENT, argument, random_ptr,
                  "Option -C takes argument after =");
  arg.AddCallback("-D", argT::CONCAT_ARGUMENT, argument, random_ptr,
                  "This option takes concatinated argument");
  arg.AddCallback("--long1", argT::NO_ARGUMENT, argument, random_ptr, "-A");
  arg.AddCallback("--long2", argT::SPACE_ARGUMENT, argument, random_ptr, "-B");
  arg.AddCallback("--long3", argT::EQUAL_ARGUMENT, argument, random_ptr,
                  "Same as -C but a bit different");
  arg.AddCallback("--long4", argT::CONCAT_ARGUMENT, argument, random_ptr,
                  "-C");

  if (!arg.Parse()) {
    std::cerr << "Problem parsing arguments" << std::endl;
    res = 1;
  }
  std::cout << "Help: " << arg.GetHelp() << std::endl;

  std::cout << "Some int variable was set to: " << some_int_variable
            << std::endl;
  std::cout << "Some double variable was set to: " << some_double_variable
            << std::endl;
  if (some_string_variable &&
      strcmp(some_string_variable, "test string with space") == 0) {
    std::cout << "Some string variable was set to: " << some_string_variable
              << std::endl;
    delete[] some_string_variable;
  } else {
    std::cerr << "Problem setting string variable" << std::endl;
    res = 1;
  }
  size_t cc;
#define CompareTwoLists(list1, list_valid, lsize)                             \
  if (list1.size() != lsize) {                                                \
    std::cerr << "Problem setting " #list1 ". Size is: " << list1.size()      \
              << " should be: " << lsize << std::endl;                        \
    res = 1;                                                                  \
  } else {                                                                    \
    std::cout << #list1 " argument set:";                                     \
    for (cc = 0; cc < lsize; ++cc) {                                          \
      std::cout << " " << list1[cc];                                          \
      if (!CompareTwoItemsOnList(list1[cc], list_valid[cc])) {                \
        std::cerr << "Problem setting " #list1 ". Value of " << cc            \
                  << " is: [" << list1[cc] << "] <> [" << list_valid[cc]      \
                  << "]" << std::endl;                                        \
        res = 1;                                                              \
        break;                                                                \
      }                                                                       \
    }                                                                         \
    std::cout << std::endl;                                                   \
  }

  CompareTwoLists(numbers_argument, valid_numbers, 10);
  CompareTwoLists(doubles_argument, valid_doubles, 3);
  CompareTwoLists(bools_argument, valid_bools, 3);
  CompareTwoLists(strings_argument, valid_strings, 4);
  CompareTwoLists(stl_strings_argument, valid_stl_strings, 4);

  std::cout << "Some STL String variable was set to: "
            << some_stl_string_variable << std::endl;
  std::cout << "Some bool variable was set to: " << some_bool_variable
            << std::endl;
  std::cout << "Some bool variable was set to: " << some_bool_variable1
            << std::endl;
  std::cout << "bool_arg1 variable was set to: " << bool_arg1 << std::endl;
  std::cout << "bool_arg2 variable was set to: " << bool_arg2 << std::endl;
  std::cout << std::endl;

  for (cc = 0; cc < strings_argument.size(); ++cc) {
    delete[] strings_argument[cc];
    strings_argument[cc] = 0;
  }
  return res;
}